

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O2

void __thiscall Simulator::return_function(Simulator *this,PCode *code)

{
  ScopeTree *this_00;
  int iVar1;
  int iVar2;
  Symbol *pSVar3;
  ScopeNode *pSVar4;
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"__ret__",&local_51);
  this_00 = &this->tree_;
  pSVar3 = ScopeTree::resolve(this_00,&local_50);
  this->eip_ = (pSVar3->value_).int_value;
  std::__cxx11::string::~string((string *)&local_50);
  do {
    std::__cxx11::string::string((string *)&local_50,"__ret__",&local_51);
    pSVar4 = ScopeTree::resolve_scope(this_00,&local_50);
    iVar1 = ScopeNode::level(pSVar4);
    pSVar4 = ScopeTree::current(this_00);
    iVar2 = ScopeNode::level(pSVar4);
    std::__cxx11::string::~string((string *)&local_50);
    ScopeTree::pop(this_00);
  } while (iVar1 != iVar2);
  return;
}

Assistant:

void Simulator::return_function(const PCode &code) {
    set_eip(tree_.resolve("__ret__").int_value());
    while (tree_.resolve_scope("__ret__")->level() != tree_.current()->level()) {
        tree_.pop();
    }
    tree_.pop();
}